

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::BufferVkImpl,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::BufferVkImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  BufferVkImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::BufferVkImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (BufferVkImpl *)0x0) {
      BufferVkImpl::~BufferVkImpl(this_00);
      RefCountedObject<Diligent::IBufferVk>::operator_delete
                ((RefCountedObject<Diligent::IBufferVk> *)this_00,in_RSI);
    }
  }
  else {
    BufferVkImpl::~BufferVkImpl(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }